

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O3

char * Granulator_GetSampleName(int index)

{
  char *pcVar1;
  MutexScopeLock mutexScope;
  MutexScopeLock local_18;
  
  if (index < 0) {
    pcVar1 = "Input";
  }
  else {
    local_18.mutex = (Mutex *)Granulator::sampleMutex;
    Mutex::Lock((Mutex *)Granulator::sampleMutex);
    if (Granulator::GetGranulatorSample(int)::initialized == '\0') {
      memset(Granulator::GetGranulatorSample(int)::samples,0,0x4280);
      Granulator::GetGranulatorSample(int)::initialized = '\x01';
    }
    pcVar1 = "Undefined";
    if (*(int *)(Granulator::GetGranulatorSample(int)::samples + (ulong)(uint)index * 0x428 + 0x10)
        != 0) {
      pcVar1 = Granulator::GetGranulatorSample(int)::samples + (ulong)(uint)index * 0x428 + 0x24;
    }
    MutexScopeLock::~MutexScopeLock(&local_18);
  }
  return pcVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API const char* Granulator_GetSampleName(int index)
{
    if (index < 0)
        return "Input";

    if (index < Granulator::MAXSAMPLE)
        ;
    {
        MutexScopeLock mutexScope(Granulator::sampleMutex);
        Granulator::GranulatorSample* s = &Granulator::GetGranulatorSample(index);
        if (s->numsamples == 0)
            return "Undefined";
        return s->name;
    }

    return "Undefined";
}